

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

Maybe<float> __thiscall kj::StringPtr::tryParseAs<float>(StringPtr *this)

{
  StringPtr *in_RSI;
  Maybe<double> local_28;
  StringPtr *this_local;
  
  this_local = this;
  kj::_::tryParseDouble((_ *)&local_28,in_RSI);
  Maybe<float>::Maybe<double>((Maybe<float> *)this,&local_28);
  Maybe<double>::~Maybe(&local_28);
  return (Maybe<float>)(NullableValue<float>)this;
}

Assistant:

Maybe<float> StringPtr::tryParseAs<float>() const { return _::tryParseDouble(*this); }